

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-vfp.inc.c
# Opt level: O2

uint64_t vfp_expand_imm_arm(int size,uint8_t imm8)

{
  if (size == 1) {
    return (ulong)((imm8 & 0x3f) * 0x40 +
                   ((uint)((imm8 & 0x40) == 0) << 0xc | (uint)(imm8 & 0x80) << 8) + 0x3000);
  }
  if (size != 2) {
    if (size == 3) {
      return (ulong)((imm8 & 0x3f) + ((uint)((imm8 & 0x40) == 0) << 6 | (uint)(imm8 & 0x80) << 8) +
                    0x3fc0) << 0x30;
    }
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-vfp.inc.c"
               ,0x3e,(char *)0x0);
  }
  return (ulong)((imm8 & 0x3f) * 0x80000 +
                 ((uint)((imm8 & 0x40) == 0) << 0x19 | (uint)(imm8 & 0x80) << 0x18) + 0x3e000000);
}

Assistant:

uint64_t vfp_expand_imm(int size, uint8_t imm8)
{
    uint64_t imm = 0;

    switch (size) {
    case MO_64:
        imm = (extract32(imm8, 7, 1) ? 0x8000 : 0) |
            (extract32(imm8, 6, 1) ? 0x3fc0 : 0x4000) |
            extract32(imm8, 0, 6);
        imm <<= 48;
        break;
    case MO_32:
        imm = (extract32(imm8, 7, 1) ? 0x8000 : 0) |
            (extract32(imm8, 6, 1) ? 0x3e00 : 0x4000) |
            (extract32(imm8, 0, 6) << 3);
        imm <<= 16;
        break;
    case MO_16:
        imm = (extract32(imm8, 7, 1) ? 0x8000 : 0) |
            (extract32(imm8, 6, 1) ? 0x3000 : 0x4000) |
            (extract32(imm8, 0, 6) << 6);
        break;
    default:
        g_assert_not_reached();
    }
    return imm;
}